

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_ghost.cpp
# Opt level: O2

Dist * Omega_h::close_up(Dist *__return_storage_ptr__,Mesh *mesh,RemoteGraph *own_verts2own_elems,
                        Dist *verts2owners)

{
  LO nrroots;
  Read<long> old_owner_globals;
  Remotes elem_uses;
  Dist uses2old_owners;
  Dist own_verts2verts;
  Write<int> WStack_2f8;
  undefined1 local_2e8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2d0;
  Remotes local_2c8;
  Remotes local_2a8;
  RemoteGraph local_288;
  Dist local_258;
  Dist local_1c8;
  Dist local_138;
  Dist local_a8;
  
  Dist::invert(&local_a8,verts2owners);
  RemoteGraph::RemoteGraph(&local_288,own_verts2own_elems);
  Dist::Dist(&local_138,&local_a8);
  push_elem_uses(&local_2a8,&local_288,&local_138);
  Dist::~Dist(&local_138);
  RemoteGraph::~RemoteGraph(&local_288);
  Mesh::comm((Mesh *)(local_2e8 + 0x10));
  Remotes::Remotes(&local_2c8,&local_2a8);
  nrroots = Mesh::nelems(mesh);
  Dist::Dist(&local_1c8,(CommPtr *)(local_2e8 + 0x10),&local_2c8,nrroots);
  Remotes::~Remotes(&local_2c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2d0);
  Mesh::dim(mesh);
  Mesh::globals((Mesh *)local_2e8,(Int)mesh);
  Dist::Dist(&local_258,&local_1c8);
  Write<long>::Write(&WStack_2f8,(Write<int> *)local_2e8);
  get_new_copies2old_owners(__return_storage_ptr__,&local_258,(GOs *)&WStack_2f8);
  Write<long>::~Write((Write<long> *)&WStack_2f8);
  Dist::~Dist(&local_258);
  Write<long>::~Write((Write<long> *)local_2e8);
  Dist::~Dist(&local_1c8);
  Remotes::~Remotes(&local_2a8);
  Dist::~Dist(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

static Dist close_up(
    Mesh* mesh, RemoteGraph own_verts2own_elems, Dist verts2owners) {
  auto own_verts2verts = verts2owners.invert();
  auto elem_uses = push_elem_uses(own_verts2own_elems, own_verts2verts);
  auto uses2old_owners = Dist(mesh->comm(), elem_uses, mesh->nelems());
  auto old_owner_globals = mesh->globals(mesh->dim());
  auto elems2owners =
      get_new_copies2old_owners(uses2old_owners, old_owner_globals);
  return elems2owners;
}